

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void kratos::LatchVisitor::check_sequential(SequentialStmtBlock *stmt)

{
  pointer pEVar1;
  undefined8 *puVar2;
  Port *port;
  pointer pEVar3;
  undefined8 *puVar4;
  undefined1 local_1d8 [8];
  unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
  ifs;
  unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
  vars;
  AssignedVarVisitor a_v;
  IfVisitor visitor;
  
  pEVar3 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar3 != pEVar1) {
    do {
      visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)pEVar3->var;
      if ((((Var *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)->type_ != PortIO) ||
         (*(int *)((long)&(((Var *)((long)visitor.super_IRVisitor.visited_._M_h._M_single_bucket +
                                   0x270))->super_IRNode)._vptr_IRNode + 4) != 1)) {
        visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
        visitor.super_IRVisitor._8_8_ =
             &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
        visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
        visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
        visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
        visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
        visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
        a_v.assigned_vars_._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_004d8da8;
        visitor.var_ = (Var *)&visitor.ifs_._M_h._M_rehash_policy._M_next_resize;
        visitor.ifs_._M_h._M_buckets = (__buckets_ptr)0x1;
        visitor.ifs_._M_h._M_bucket_count = 0;
        visitor.ifs_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        visitor.ifs_._M_h._M_element_count._0_4_ = 0x3f800000;
        visitor.ifs_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        visitor.ifs_._M_h._M_rehash_policy._4_4_ = 0;
        visitor.ifs_._M_h._M_rehash_policy._M_next_resize = 0;
        IRVisitor::visit_root((IRVisitor *)&a_v.assigned_vars_._M_h._M_single_bucket,(IRNode *)stmt)
        ;
        local_1d8 = (undefined1  [8])0x0;
        ifs._M_h._M_buckets = visitor.ifs_._M_h._M_buckets;
        ifs._M_h._M_bucket_count = 0;
        ifs._M_h._M_before_begin = visitor.ifs_._M_h._M_before_begin;
        ifs._M_h._M_element_count =
             CONCAT44(visitor.ifs_._M_h._M_element_count._4_4_,
                      (undefined4)visitor.ifs_._M_h._M_element_count);
        ifs._M_h._M_rehash_policy._M_max_load_factor =
             visitor.ifs_._M_h._M_rehash_policy._M_max_load_factor;
        ifs._M_h._M_rehash_policy._4_4_ = visitor.ifs_._M_h._M_rehash_policy._4_4_;
        ifs._M_h._M_rehash_policy._M_next_resize = 0;
        vars._M_h._M_single_bucket = (__node_base_ptr)local_1d8;
        std::
        _Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<kratos::IfStmt*,false>>>>
                  ((_Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)vars._M_h._M_single_bucket,
                   (_Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&visitor.var_,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<kratos::IfStmt_*,_false>_>_>
                    *)&vars._M_h._M_single_bucket);
        for (puVar2 = (undefined8 *)ifs._M_h._M_bucket_count; puVar2 != (undefined8 *)0x0;
            puVar2 = (undefined8 *)*puVar2) {
          a_v.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
          a_v.super_IRVisitor._8_8_ =
               &a_v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
          a_v.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
          a_v.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
          a_v.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          a_v.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
          a_v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          a_v.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
          a_v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
          vars._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_004d8c28;
          a_v.super_IRVisitor.visited_._M_h._M_single_bucket =
               (__node_base_ptr)&a_v.assigned_vars_._M_h._M_rehash_policy._M_next_resize;
          a_v.assigned_vars_._M_h._M_buckets = (__buckets_ptr)0x1;
          a_v.assigned_vars_._M_h._M_bucket_count = 0;
          a_v.assigned_vars_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          a_v.assigned_vars_._M_h._M_element_count._0_4_ = 0x3f800000;
          a_v.assigned_vars_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          a_v.assigned_vars_._M_h._M_rehash_policy._4_4_ = 0;
          a_v.assigned_vars_._M_h._M_rehash_policy._M_next_resize = 0;
          IRVisitor::visit_root
                    ((IRVisitor *)&vars._M_h._M_single_bucket,*(IRNode **)(puVar2[1] + 0xe0));
          ifs._M_h._M_single_bucket = (__node_base_ptr)0x0;
          vars._M_h._M_buckets = a_v.assigned_vars_._M_h._M_buckets;
          vars._M_h._M_bucket_count = 0;
          vars._M_h._M_before_begin = a_v.assigned_vars_._M_h._M_before_begin;
          vars._M_h._M_element_count =
               CONCAT44(a_v.assigned_vars_._M_h._M_element_count._4_4_,
                        (undefined4)a_v.assigned_vars_._M_h._M_element_count);
          vars._M_h._M_rehash_policy._M_max_load_factor =
               a_v.assigned_vars_._M_h._M_rehash_policy._M_max_load_factor;
          vars._M_h._M_rehash_policy._4_4_ = a_v.assigned_vars_._M_h._M_rehash_policy._4_4_;
          vars._M_h._M_rehash_policy._M_next_resize = 0;
          visitor.ifs_._M_h._M_single_bucket = (__node_base_ptr)&ifs._M_h._M_single_bucket;
          std::
          _Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>,std::allocator<std::pair<kratos::Var*const,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_assign<std::_Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>,std::allocator<std::pair<kratos::Var*const,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Var*const,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>,false>>>>
                    ((_Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>,std::allocator<std::pair<kratos::Var*const,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)visitor.ifs_._M_h._M_single_bucket,
                     (_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)&a_v.super_IRVisitor.visited_._M_h._M_single_bucket,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_false>_>_>
                      *)&visitor.ifs_._M_h._M_single_bucket);
          for (puVar4 = (undefined8 *)vars._M_h._M_bucket_count; puVar4 != (undefined8 *)0x0;
              puVar4 = (undefined8 *)*puVar4) {
            check_stmt_block(*(StmtBlock **)(puVar2[1] + 0xf0),(Var *)puVar4[1],
                             (vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)(puVar4 + 2)
                             ,false);
          }
          std::
          _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&ifs._M_h._M_single_bucket);
          vars._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_004d8c28;
          std::
          _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&a_v.super_IRVisitor.visited_._M_h._M_single_bucket);
          vars._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_004d3260;
          std::
          _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&a_v.super_IRVisitor.level);
        }
        std::
        _Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_1d8);
        a_v.assigned_vars_._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_004d8da8;
        std::
        _Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&visitor.var_);
        a_v.assigned_vars_._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_004d3260;
        std::
        _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&visitor.super_IRVisitor.level);
      }
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar1);
  }
  return;
}

Assistant:

void static check_sequential(SequentialStmtBlock* stmt) {
        auto const& conditions = stmt->get_event_controls();
        // we care about non-clock
        for (auto const& iter : conditions) {
            auto* var = iter.var;
            if (var->type() == VarType::PortIO) {
                auto* port = reinterpret_cast<Port*>(var);
                if (port->port_type() == PortType::Clock) continue;
            }
            // check every if statement that's targeted by that variable
            IfVisitor visitor(var);
            visitor.visit_root(stmt);
            auto ifs = visitor.ifs();
            // derive the variables to check
            for (auto const& if_ : ifs) {
                AssignedVarVisitor a_v;
                a_v.visit_root(if_->then_body().get());
                auto vars = a_v.assigned_vars();
                for (auto const& [v, stmts] : vars) {
                    check_stmt_block(if_->else_body().get(), v, stmts, false);
                }
            }
        }
    }